

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.cpp
# Opt level: O2

void test_qclab_qgates_PointerGate1<std::complex<double>>(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_R9;
  vector<int,_std::allocator<int>_> qubits;
  AssertionResult gtest_ar_7;
  PointerGate1<std::complex<double>_> PX;
  AssertHelper local_3c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3b8;
  PointerGate1<std::complex<double>_> PZ;
  PointerGate1<std::complex<double>_> P;
  PauliZ<std::complex<double>_> Z;
  PauliX<std::complex<double>_> X2;
  AssertionResult gtest_ar__7;
  stringstream qasm2;
  undefined7 uStack_34f;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  undefined1 local_340 [376];
  stringstream qasm;
  undefined7 uStack_1c7;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c0;
  undefined1 local_1b8 [376];
  PauliX<std::complex<double>_> X;
  
  X.super_QGate1<std::complex<double>_>.qubit_ = 0;
  X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cbe88;
  P.super_QGate1<std::complex<double>_>.qubit_ = 0;
  P.super_QGate1<std::complex<double>_>._12_4_ = 0;
  P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cf9f0;
  _qasm2 = 1;
  gtest_ar_7._0_4_ = 1;
  P.gate_ = &X.super_QGate1<std::complex<double>_>;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.nbQubits()","1",(int *)&qasm2,(int *)&gtest_ar_7);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0xd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[1])();
  qasm2 = (stringstream)(char)iVar2;
  local_348._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&qasm2,(AssertionResult *)"P.fixed()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0xe,(char *)CONCAT71(uStack_1c7,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    std::__cxx11::string::~string((string *)&qasm);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  qasm = (stringstream)0x1;
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  _qasm2 = iVar2 + P.super_QGate1<std::complex<double>_>._12_4_;
  gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.qubit()","0",(int *)&qasm2,(int *)&gtest_ar_7);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  _qasm2 = P.super_QGate1<std::complex<double>_>._12_4_;
  gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.offset()","0",(int *)&qasm2,(int *)&gtest_ar_7);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  _qasm2 = (pointer)P.gate_;
  gtest_ar_7._0_8_ = &X.super_QGate1<std::complex<double>_>;
  testing::internal::
  CmpHelperEQ<qclab::qgates::QGate1<std::complex<double>>*,qclab::qgates::PauliX<std::complex<double>>*>
            ((internal *)&qasm,"P.ptr()","&X",(QGate1<std::complex<double>_> **)&qasm2,
             (PauliX<std::complex<double>_> **)&gtest_ar_7);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((QGate1<std::complex<double>_> *)_qasm2 != (QGate1<std::complex<double>_> *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qclab::qgates::PointerGate1<std::complex<double>_>::qubits(&qubits,&P);
  _qasm2 = (pointer)((long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  gtest_ar_7._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&qasm,"qubits.size()","1",(unsigned_long *)&qasm2,(int *)&gtest_ar_7);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  _qasm2 = _qasm2 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[0]","0",
             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(int *)&qasm2);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&qasm);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&gtest_ar_7)
  ;
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&qasm,
                     (SquareMatrix<std::complex<double>_> *)&gtest_ar_7);
  qasm2 = (stringstream)bVar1;
  local_348._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar_7.message_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &local_1c0);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&qasm2,(AssertionResult *)"P.matrix() == X.matrix()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x1a,(char *)CONCAT71(uStack_1c7,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    std::__cxx11::string::~string((string *)&qasm);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iVar2 = (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[0xb])
                    (P.gate_,local_1b8,(ulong)P.super_QGate1<std::complex<double>_>._8_8_ >> 0x20);
  gtest_ar_7._0_4_ = iVar2;
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject &
       0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.toQASM( qasm )","0",(int *)&gtest_ar_7,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar_7,"qasm.str()","\"x q[0];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qasm2,
             (char (*) [9])0x3cdb14);
  std::__cxx11::string::~string((string *)&qasm2);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&qasm2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  P.super_QGate1<std::complex<double>_>._12_4_ = 3;
  gtest_ar_7._0_4_ = 3;
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_ =
       3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.offset()","3",(int *)&gtest_ar_7,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  iVar2 = (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  gtest_ar_7._0_4_ = iVar2 + P.super_QGate1<std::complex<double>_>._12_4_;
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_ =
       3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.qubit()","3",(int *)&gtest_ar_7,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  qclab::qgates::PointerGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm2,&P);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_ =
       3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_7,"P.qubits()[0]","3",(int *)_qasm2,(int *)&PX);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm2);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&qasm2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm2);
  iVar2 = (*((P.gate_)->super_QObject<std::complex<double>_>)._vptr_QObject[0xb])
                    (P.gate_,local_340,(ulong)P.super_QGate1<std::complex<double>_>._8_8_ >> 0x20);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_ =
       iVar2;
  PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject &
       0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_7,"P.toQASM( qasm2 )","0",(int *)&PX,(int *)&PZ);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&PX);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PZ,(Message *)&PX);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PZ);
    if (PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject !=
        (_func_int **)0x0) {
      (**(code **)(*PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&PX,"qasm2.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_7,
             (char (*) [9])"x q[3];\n");
  std::__cxx11::string::~string((string *)&gtest_ar_7);
  if ((char)PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (PX.super_QGate1<std::complex<double>_>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)PX.super_QGate1<std::complex<double>_>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PZ,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PZ);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&PX.super_QGate1<std::complex<double>_>.qubit_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&X);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_1_ =
       (char)iVar2;
  PX.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PX.super_QGate1<std::complex<double>_>._12_4_ = 0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&PZ);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&PX,(AssertionResult *)"P == X","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&Z,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x2b,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&Z,(Message *)&PZ);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&Z);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject !=
        (_func_int **)0x0) {
      (**(code **)(*PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&PX.super_QGate1<std::complex<double>_>.qubit_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&X);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_1_ =
       (char)iVar2;
  PX.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PX.super_QGate1<std::complex<double>_>._12_4_ = 0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&PZ);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&PX,(AssertionResult *)"P != X","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&Z,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x2c,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&Z,(Message *)&PZ);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&Z);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject !=
        (_func_int **)0x0) {
      (**(code **)(*PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&PX.super_QGate1<std::complex<double>_>.qubit_);
  Z.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Z.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cc068;
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])();
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)
       (CONCAT71(PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                 _vptr_QObject._1_7_,(char)iVar2) ^ 1);
  PX.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PX.super_QGate1<std::complex<double>_>._12_4_ = 0;
  if ((char)iVar2 != '\0') {
    testing::Message::Message((Message *)&PZ);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&PX,(AssertionResult *)"P != Z","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x2e,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X2,(Message *)&PZ);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X2);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject !=
        (_func_int **)0x0) {
      (**(code **)(*PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&PX.super_QGate1<std::complex<double>_>.qubit_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&Z.super_QGate1<std::complex<double>_>);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)
       (CONCAT71(PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                 _vptr_QObject._1_7_,(char)iVar2) ^ 1);
  PX.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PX.super_QGate1<std::complex<double>_>._12_4_ = 0;
  if ((char)iVar2 != '\0') {
    testing::Message::Message((Message *)&PZ);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&PX,(AssertionResult *)"P == Z","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x2f,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X2,(Message *)&PZ);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X2);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject !=
        (_func_int **)0x0) {
      (**(code **)(*PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&PX.super_QGate1<std::complex<double>_>.qubit_);
  PX.gate_ = &X2.super_QGate1<std::complex<double>_>;
  X2.super_QGate1<std::complex<double>_>.qubit_ = 0;
  X2.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cbe88;
  PX.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PX.super_QGate1<std::complex<double>_>._12_4_ = 0;
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cf9f0;
  PZ.super_QGate1<std::complex<double>_>.qubit_ = 0;
  PZ.super_QGate1<std::complex<double>_>._12_4_ = 0;
  PZ.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cf9f0;
  PZ.gate_ = &Z.super_QGate1<std::complex<double>_>;
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])();
  gtest_ar__7.success_ = SUB41(iVar2,0);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__7.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar__7,(AssertionResult *)"P == PX","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x33,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&PX);
  gtest_ar__7.success_ = SUB41(iVar2,0);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__7.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar__7,(AssertionResult *)"P != PX","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x34,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&PZ);
  gtest_ar__7.success_ = (bool)((byte)iVar2 ^ 1);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if ((byte)iVar2 != 0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar__7,(AssertionResult *)"P != PZ","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x35,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xe])(&P,&PZ);
  gtest_ar__7.success_ = (bool)((byte)iVar2 ^ 1);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if ((byte)iVar2 != 0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar__7,(AssertionResult *)"P == PZ","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x36,(char *)gtest_ar_7._0_8_);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX((PauliX<std::complex<double>_> *)&P,5);
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_7._0_8_ = &PTR_nbQubits_004cf9f0;
  _qasm2 = 1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.nbQubits()","1",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [1])();
  qasm2 = (stringstream)(char)iVar2;
  local_348._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&qubits);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&qasm2,(AssertionResult *)"P.fixed()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x3e,(char *)CONCAT71(uStack_1c7,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    std::__cxx11::string::~string((string *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  qasm = (stringstream)0x1;
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [3])();
  _qasm2 = iVar2 + gtest_ar_7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.qubit()","5",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qclab::qgates::PointerGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,
             (PointerGate1<std::complex<double>_> *)&gtest_ar_7);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.qubits()[0]","5",(int *)CONCAT71(uStack_1c7,qasm),(int *)&qubits)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)CONCAT71(uStack_1c7,qasm) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_1c7,qasm) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  _qasm2 = gtest_ar_7.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.offset()","0",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&P;
  _qasm2 = (pointer)&P;
  testing::internal::
  CmpHelperEQ<qclab::qgates::QGate1<std::complex<double>>*,qclab::qgates::PauliX<std::complex<double>>*>
            ((internal *)&qasm,"P.ptr()","&X",(QGate1<std::complex<double>_> **)&qasm2,
             (PauliX<std::complex<double>_> **)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xb])(&P,local_1b8,
                   (ulong)gtest_ar_7.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl >> 0x20);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,iVar2);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject &
       0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.toQASM( qasm )","0",(int *)&qubits,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&qubits,"qasm.str()","\"x q[5];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qasm2,
             (char (*) [9])"x q[5];\n");
  std::__cxx11::string::~string((string *)&qasm2);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm2);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  P.super_QGate1<std::complex<double>_>._8_8_ =
       P.super_QGate1<std::complex<double>_>._8_8_ & 0xffffffff00000000;
  P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cbe88;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x300000000;
  gtest_ar_7._0_8_ = &PTR_nbQubits_004cf9f0;
  _qasm2 = 1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.nbQubits()","1",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [1])();
  qasm2 = (stringstream)(char)iVar2;
  local_348._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&qubits);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&qasm2,(AssertionResult *)"P.fixed()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x50,(char *)CONCAT71(uStack_1c7,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    std::__cxx11::string::~string((string *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  qasm = (stringstream)0x1;
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [3])();
  _qasm2 = iVar2 + gtest_ar_7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.qubit()","3",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qclab::qgates::PointerGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,
             (PointerGate1<std::complex<double>_> *)&gtest_ar_7);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.qubits()[0]","3",(int *)CONCAT71(uStack_1c7,qasm),(int *)&qubits)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)CONCAT71(uStack_1c7,qasm) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_1c7,qasm) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  _qasm2 = gtest_ar_7.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.offset()","3",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&P;
  _qasm2 = (pointer)&P;
  testing::internal::
  CmpHelperEQ<qclab::qgates::QGate1<std::complex<double>>*,qclab::qgates::PauliX<std::complex<double>>*>
            ((internal *)&qasm,"P.ptr()","&X",(QGate1<std::complex<double>_> **)&qasm2,
             (PauliX<std::complex<double>_> **)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xb])(&P,local_1b8,
                   (ulong)gtest_ar_7.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl >> 0x20);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,iVar2);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject &
       0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.toQASM( qasm )","0",(int *)&qubits,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&qubits,"qasm.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qasm2,
             (char (*) [9])"x q[3];\n");
  std::__cxx11::string::~string((string *)&qasm2);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm2);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX((PauliX<std::complex<double>_> *)&P,4);
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x300000000;
  gtest_ar_7._0_8_ = &PTR_nbQubits_004cf9f0;
  _qasm2 = 1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.nbQubits()","1",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [1])();
  qasm2 = (stringstream)(char)iVar2;
  local_348._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar2 == '\0') {
    testing::Message::Message((Message *)&qubits);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&qasm2,(AssertionResult *)"P.fixed()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x62,(char *)CONCAT71(uStack_1c7,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    std::__cxx11::string::~string((string *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  qasm = (stringstream)0x1;
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [3])();
  _qasm2 = iVar2 + gtest_ar_7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,7);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.qubit()","7",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qclab::qgates::PointerGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,
             (PointerGate1<std::complex<double>_> *)&gtest_ar_7);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,7);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.qubits()[0]","7",(int *)CONCAT71(uStack_1c7,qasm),(int *)&qubits)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)CONCAT71(uStack_1c7,qasm) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_1c7,qasm) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  _qasm2 = gtest_ar_7.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"P.offset()","3",(int *)&qasm2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((long *)_qasm2 != (long *)0x0) {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&P;
  _qasm2 = (pointer)&P;
  testing::internal::
  CmpHelperEQ<qclab::qgates::QGate1<std::complex<double>>*,qclab::qgates::PauliX<std::complex<double>>*>
            ((internal *)&qasm,"P.ptr()","&X",(QGate1<std::complex<double>_> **)&qasm2,
             (PauliX<std::complex<double>_> **)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qasm2);
    if (local_1c0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1c0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c0);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iVar2 = (*P.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xb])(&P,local_1b8,
                   (ulong)gtest_ar_7.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl >> 0x20);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,iVar2);
  PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       PX.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject &
       0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm2,"P.toQASM( qasm )","0",(int *)&qubits,(int *)&PX);
  if (qasm2 == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (local_348._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_348._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&qubits,"qasm.str()","\"x q[7];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qasm2,
             (char (*) [9])"x q[7];\n");
  std::__cxx11::string::~string((string *)&qasm2);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm2);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&PX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/test/qgates/PointerGate1.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&PX,(Message *)&qasm2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PX);
    if ((PointerGate1<std::complex<double>_> *)_qasm2 != (PointerGate1<std::complex<double>_> *)0x0)
    {
      (**(code **)(*(long *)_qasm2 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  return;
}

Assistant:

void test_qclab_qgates_PointerGate1() {

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 0 ) ;      // qubit
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // qubits
    auto qubits = P.qubits() ;
    EXPECT_EQ( qubits.size() , 1 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;

    // matrix
    EXPECT_TRUE( P.matrix() == X.matrix() ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\n" ) ;

    // setOffset
    P.setOffset( 3 ) ;
    EXPECT_EQ( P.offset() , 3 ) ;
    EXPECT_EQ( P.qubit() , 3 ) ;
    EXPECT_EQ( P.qubits()[0] , 3 ) ;
    std::stringstream qasm2 ;
    EXPECT_EQ( P.toQASM( qasm2 ) , 0 ) ;
    EXPECT_EQ( qasm2.str() , "x q[3];\n" ) ;

    // operators == and !=
    EXPECT_TRUE(  P == X ) ;
    EXPECT_FALSE( P != X ) ;
    qclab::qgates::PauliZ< T >  Z ;
    EXPECT_TRUE(  P != Z ) ;
    EXPECT_FALSE( P == Z ) ;
    qclab::qgates::PauliX< T >  X2 ;
    qclab::qgates::PointerGate1< T > PX( &X2 ) ;
    qclab::qgates::PointerGate1< T > PZ( &Z ) ;
    EXPECT_TRUE(  P == PX ) ;
    EXPECT_FALSE( P != PX ) ;
    EXPECT_TRUE(  P != PZ ) ;
    EXPECT_FALSE( P == PZ ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 5 ) ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 5 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 5 ) ;  // qubits
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[5];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 3 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 3 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[3];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 4 ) ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 7 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 7 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[7];\n" ) ;
  }

}